

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstToYaml.cpp
# Opt level: O2

void MyCompiler::Util::processAst<MyCompiler::ConstDefinition>
               (ConstDefinition *ast,int level,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *items,string *name)

{
  allocator local_75;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_74 = level;
  std::__cxx11::string::string((string *)&local_30,"- ident: \"",&local_75);
  std::operator+(&local_70,&local_30,
                 &(((ast->pIdent).super___shared_ptr<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_AbstractAstNode).value);
  std::operator+(&local_50,&local_70,"\"");
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_74,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_70,"  number: ",(allocator *)&local_30);
  std::operator+(&local_50,&local_70,
                 &(((ast->pNumber).
                    super___shared_ptr<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_AbstractAstNode).value);
  std::
  vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>::
  emplace_back<int&,std::__cxx11::string>
            ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              *)items,&local_74,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void MyCompiler::Util::processAst<MyCompiler::ConstDefinition>(
        ConstDefinition &ast, int level,
        std::vector<std::pair<int, std::string>> &items, const std::string &name)
{
    items.emplace_back(level, std::string("- ident: \"") + ast.pIdent->value + "\"");
    items.emplace_back(level, std::string("  number: ") + ast.pNumber->value);
}